

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleInt32::write
          (PLYValueLittleInt32 *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  char cVar2;
  
  cVar2 = (char)__fd;
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  std::streambuf::sputc(cVar2);
  sVar1 = std::streambuf::sputc(cVar2);
  return sVar1;
}

Assistant:

void write(std::streambuf *out, int v)
    {
      out->sputc(static_cast<char>(v&0xff));
      out->sputc(static_cast<char>((v>>8)&0xff));
      out->sputc(static_cast<char>((v>>16)&0xff));
      out->sputc(static_cast<char>((v>>24)&0xff));
    }